

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMap.c
# Opt level: O2

Abc_Ntk_t *
Abc_NtkMap(Abc_Ntk_t *pNtk,double DelayTarget,double AreaMulti,double DelayMulti,float LogFan,
          float Slew,float Gain,int nGatesMin,int fRecovery,int fSwitching,int fSkipFanout,
          int fUseProfile,int fUseBuffs,int fVerbose)

{
  float *pSwitching;
  int iVar1;
  int iVar2;
  abctime aVar3;
  Mio_Library_t *pLib;
  void *pvVar4;
  Mio_Library_t *pMVar5;
  Map_SuperLib_t *p;
  char *pcVar6;
  char *pcVar7;
  Vec_Int_t *p_00;
  Map_Man_t *p_01;
  Abc_Ntk_t *pNtk_00;
  Abc_Obj_t *pAVar8;
  Map_Node_t **ppMVar9;
  Vec_Ptr_t *pVVar10;
  Map_Node_t *pMVar11;
  Abc_Obj_t *pAVar12;
  Abc_Ntk_t *pAVar13;
  abctime aVar14;
  Abc_Ntk_t *pNtk_01;
  long lVar15;
  
  aVar3 = Abc_Clock();
  pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcMap.c"
                  ,0x48,
                  "Abc_Ntk_t *Abc_NtkMap(Abc_Ntk_t *, double, double, double, float, float, float, int, int, int, int, int, int, int)"
                 );
  }
  pvVar4 = Abc_FrameReadLibScl();
  if (pvVar4 != (void *)0x0) {
    pvVar4 = Abc_FrameReadLibScl();
    iVar1 = Abc_SclHasDelayInfo(pvVar4);
    if (iVar1 != 0) {
      if ((pLib == (Mio_Library_t *)0x0) || (iVar1 = Mio_LibraryHasProfile(pLib), iVar1 == 0)) {
        pvVar4 = Abc_FrameReadLibScl();
        pLib = (Mio_Library_t *)0x0;
      }
      else {
        pvVar4 = Abc_FrameReadLibScl();
      }
      pLib = Abc_SclDeriveGenlib(pvVar4,pLib,Slew,Gain,nGatesMin,fVerbose);
      pvVar4 = Abc_FrameReadLibGen();
      if (pvVar4 != (void *)0x0) {
        pMVar5 = (Mio_Library_t *)Abc_FrameReadLibGen();
        Mio_LibraryTransferDelays(pMVar5,pLib);
        pMVar5 = (Mio_Library_t *)Abc_FrameReadLibGen();
        Mio_LibraryTransferProfile(pLib,pMVar5);
      }
      p = (Map_SuperLib_t *)Abc_FrameReadLibSuper();
      Map_SuperLibFree(p);
      Abc_FrameSetLibSuper((void *)0x0);
    }
  }
  if (pLib == (Mio_Library_t *)0x0) {
    puts("The current library is not available.");
  }
  else {
    if ((AreaMulti != 0.0) || (NAN(AreaMulti))) {
      Abc_NtkMap_fUseMulti = '\x01';
      printf("The cell areas are multiplied by the factor: <num_fanins> ^ (%.2f).\n");
    }
    if ((DelayMulti != 0.0) || (NAN(DelayMulti))) {
      Abc_NtkMap_fUseMulti = '\x01';
      printf("The cell delays are multiplied by the factor: <num_fanins> ^ (%.2f).\n",DelayMulti);
    }
    if ((AreaMulti != 0.0) || (NAN(AreaMulti))) {
      Mio_LibraryMultiArea(pLib,AreaMulti);
    }
    if ((DelayMulti != 0.0) || (NAN(DelayMulti))) {
      Mio_LibraryMultiDelay(pLib,DelayMulti);
    }
    if ((Abc_NtkMap_fUseMulti != '\0') || (pvVar4 = Abc_FrameReadLibSuper(), pvVar4 == (void *)0x0))
    {
      if (fVerbose != 0) {
        pcVar6 = Mio_LibraryReadName(pLib);
        pcVar7 = Mio_LibraryReadName(pLib);
        pcVar7 = Extra_FileNameGenericAppend(pcVar7,".super");
        printf("Converting \"%s\" into supergate library \"%s\".\n",pcVar6,pcVar7);
      }
      iVar1 = Mio_LibraryHasProfile(pLib);
      if (iVar1 != 0) {
        puts("Abc_NtkMap(): Genlib library has profile.");
      }
      Map_SuperLibDeriveFromGenlib(pLib,fVerbose);
    }
    if ((AreaMulti != 0.0) || (NAN(AreaMulti))) {
      pMVar5 = (Mio_Library_t *)Abc_FrameReadLibGen();
      Mio_LibraryMultiArea(pMVar5,-AreaMulti);
    }
    if ((DelayMulti != 0.0) || (NAN(DelayMulti))) {
      pMVar5 = (Mio_Library_t *)Abc_FrameReadLibGen();
      Mio_LibraryMultiDelay(pMVar5,-DelayMulti);
    }
    if ((fVerbose != 0) && (iVar1 = Abc_NtkGetChoiceNum(pNtk), iVar1 != 0)) {
      puts("Performing mapping with choices.");
    }
    p_00 = Sim_NtkComputeSwitching(pNtk,0x1000);
    pSwitching = (float *)p_00->pArray;
    p_01 = Abc_NtkToMap(pNtk,DelayTarget,fRecovery,pSwitching,fVerbose);
    if (pSwitching != (float *)0x0) {
      Vec_IntFree(p_00);
    }
    if (p_01 != (Map_Man_t *)0x0) {
      Abc_Clock();
      Map_ManSetSwitching(p_01,fSwitching);
      Map_ManSetSkipFanout(p_01,fSkipFanout);
      if (fUseProfile != 0) {
        Map_ManSetUseProfile(p_01);
      }
      if ((LogFan != 0.0) || (NAN(LogFan))) {
        Map_ManCreateNodeDelays(p_01,(int)LogFan);
      }
      iVar1 = Map_Mapping(p_01);
      if (iVar1 == 0) {
        Map_ManFree(p_01);
      }
      else {
        iVar1 = Map_ManReadBufNum(p_01);
        if (iVar1 != pNtk->nBarBufs) {
          __assert_fail("Map_ManReadBufNum(pMan) == pNtk->nBarBufs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcMap.c"
                        ,0x1dd,"Abc_Ntk_t *Abc_NtkFromMap(Map_Man_t *, Abc_Ntk_t *, int)");
        }
        pNtk_00 = Abc_NtkStartFrom(pNtk,ABC_NTK_LOGIC,ABC_FUNC_MAP);
        Map_ManCleanData(p_01);
        lVar15 = 0;
        while( true ) {
          pVVar10 = pNtk->vCis;
          if (pVVar10->nSize <= lVar15) break;
          pAVar8 = Abc_NtkCi(pNtk,(int)lVar15);
          pVVar10 = pNtk->vCis;
          if ((long)pVVar10->nSize - (long)pNtk->nBarBufs <= lVar15) break;
          ppMVar9 = Map_ManReadInputs(p_01);
          Map_NodeSetData(ppMVar9[lVar15],1,(char *)(pAVar8->field_6).pTemp);
          lVar15 = lVar15 + 1;
        }
        for (iVar1 = 0; iVar1 < pVVar10->nSize; iVar1 = iVar1 + 1) {
          pAVar8 = Abc_NtkCi(pNtk,iVar1);
          pVVar10 = pNtk->vCis;
          if (pVVar10->nSize - pNtk->nBarBufs <= iVar1) {
            ppMVar9 = Map_ManReadBufs(p_01);
            Map_NodeSetData(ppMVar9[(pNtk->nBarBufs - pNtk->vCis->nSize) + iVar1],1,
                            (char *)(pAVar8->field_6).pTemp);
            pVVar10 = pNtk->vCis;
          }
        }
        for (iVar1 = 0; iVar2 = pNtk->vCos->nSize, iVar1 < iVar2; iVar1 = iVar1 + 1) {
          pAVar8 = Abc_NtkCo(pNtk,iVar1);
          iVar2 = pNtk->vCos->nSize;
          if (iVar2 - pNtk->nBarBufs <= iVar1) {
            pMVar11 = Map_ManReadBufDriver(p_01,(pNtk->nBarBufs - iVar2) + iVar1);
            pAVar12 = Abc_NodeFromMap_rec(pNtk_00,(Map_Node_t *)
                                                  ((ulong)pMVar11 & 0xfffffffffffffffe),
                                          ~(uint)pMVar11 & 1);
            if (((ulong)pAVar12 & 1) != 0) {
              __assert_fail("!Abc_ObjIsComplement(pNodeNew)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcMap.c"
                            ,0x1f5,"Abc_Ntk_t *Abc_NtkFromMap(Map_Man_t *, Abc_Ntk_t *, int)");
            }
            Abc_ObjAddFanin((pAVar8->field_6).pCopy,pAVar12);
          }
        }
        for (lVar15 = 0;
            (lVar15 < iVar2 &&
            (pAVar8 = Abc_NtkCo(pNtk,(int)lVar15),
            lVar15 < (long)pNtk->vCos->nSize - (long)pNtk->nBarBufs)); lVar15 = lVar15 + 1) {
          ppMVar9 = Map_ManReadOutputs(p_01);
          pAVar12 = Abc_NodeFromMap_rec(pNtk_00,(Map_Node_t *)
                                                ((ulong)ppMVar9[lVar15] & 0xfffffffffffffffe),
                                        ~(uint)ppMVar9[lVar15] & 1);
          if (((ulong)pAVar12 & 1) != 0) {
            __assert_fail("!Abc_ObjIsComplement(pNodeNew)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcMap.c"
                          ,0x1fe,"Abc_Ntk_t *Abc_NtkFromMap(Map_Man_t *, Abc_Ntk_t *, int)");
          }
          Abc_ObjAddFanin((pAVar8->field_6).pCopy,pAVar12);
          iVar2 = pNtk->vCos->nSize;
        }
        Abc_NtkLogicMakeSimpleCos(pNtk_00,(uint)(DelayTarget != 1000000000.0 && fUseBuffs == 0));
        iVar1 = Mio_LibraryHasProfile(pLib);
        if (iVar1 != 0) {
          pMVar5 = (Mio_Library_t *)Abc_FrameReadLibGen();
          Mio_LibraryTransferProfile2(pMVar5,pLib);
        }
        Map_ManFree(p_01);
        if (pNtk_00 != (Abc_Ntk_t *)0x0) {
          pNtk_01 = pNtk->pExdc;
          if (pNtk_01 != (Abc_Ntk_t *)0x0) {
            pAVar13 = Abc_NtkDup(pNtk_01);
            pNtk_00->pExdc = pAVar13;
          }
          iVar1 = (int)pNtk_01;
          if (fVerbose != 0) {
            Abc_Print(iVar1,"%s =","Total runtime");
            aVar14 = Abc_Clock();
            Abc_Print(iVar1,"%9.2f sec\n",(double)(aVar14 - aVar3) / 1000000.0);
          }
          iVar1 = Abc_NtkCheck(pNtk_00);
          if (iVar1 != 0) {
            return pNtk_00;
          }
          puts("Abc_NtkMap: The network check has failed.");
          Abc_NtkDelete(pNtk_00);
        }
      }
    }
  }
  return (Abc_Ntk_t *)0x0;
}

Assistant:

Abc_Ntk_t * Abc_NtkMap( Abc_Ntk_t * pNtk, double DelayTarget, double AreaMulti, double DelayMulti, float LogFan, float Slew, float Gain, int nGatesMin, int fRecovery, int fSwitching, int fSkipFanout, int fUseProfile, int fUseBuffs, int fVerbose )
{
    static int fUseMulti = 0;
    int fShowSwitching = 1;
    Abc_Ntk_t * pNtkNew;
    Map_Man_t * pMan;
    Vec_Int_t * vSwitching = NULL;
    float * pSwitching = NULL;
    abctime clk, clkTotal = Abc_Clock();
    Mio_Library_t * pLib = (Mio_Library_t *)Abc_FrameReadLibGen();

    assert( Abc_NtkIsStrash(pNtk) );
    // derive library from SCL
    // if the library is created here, it will be deleted when pSuperLib is deleted in Map_SuperLibFree()
    if ( Abc_FrameReadLibScl() && Abc_SclHasDelayInfo( Abc_FrameReadLibScl() ) )
    {
        if ( pLib && Mio_LibraryHasProfile(pLib) )
            pLib = Abc_SclDeriveGenlib( Abc_FrameReadLibScl(), pLib, Slew, Gain, nGatesMin, fVerbose );
        else
            pLib = Abc_SclDeriveGenlib( Abc_FrameReadLibScl(), NULL, Slew, Gain, nGatesMin, fVerbose );
        if ( Abc_FrameReadLibGen() )
        {
            Mio_LibraryTransferDelays( (Mio_Library_t *)Abc_FrameReadLibGen(), pLib );
            Mio_LibraryTransferProfile( pLib, (Mio_Library_t *)Abc_FrameReadLibGen() );
        }
        // remove supergate library
        Map_SuperLibFree( (Map_SuperLib_t *)Abc_FrameReadLibSuper() );
        Abc_FrameSetLibSuper( NULL );
    }
    // quit if there is no library
    if ( pLib == NULL )
    {
        printf( "The current library is not available.\n" );
        return 0;
    }
    if ( AreaMulti != 0.0 )
        fUseMulti = 1, printf( "The cell areas are multiplied by the factor: <num_fanins> ^ (%.2f).\n", AreaMulti );
    if ( DelayMulti != 0.0 )
        fUseMulti = 1, printf( "The cell delays are multiplied by the factor: <num_fanins> ^ (%.2f).\n", DelayMulti );

    // penalize large gates by increasing their area
    if ( AreaMulti != 0.0 )
        Mio_LibraryMultiArea( pLib, AreaMulti );
    if ( DelayMulti != 0.0 )
        Mio_LibraryMultiDelay( pLib, DelayMulti );

    // derive the supergate library
    if ( fUseMulti || Abc_FrameReadLibSuper() == NULL )
    {
        if ( fVerbose )
            printf( "Converting \"%s\" into supergate library \"%s\".\n", 
                Mio_LibraryReadName(pLib), Extra_FileNameGenericAppend(Mio_LibraryReadName(pLib), ".super") );
        // compute supergate library to be used for mapping
        if ( Mio_LibraryHasProfile(pLib) )
            printf( "Abc_NtkMap(): Genlib library has profile.\n" );
        Map_SuperLibDeriveFromGenlib( pLib, fVerbose );
    }

    // return the library to normal
    if ( AreaMulti != 0.0 )
        Mio_LibraryMultiArea( (Mio_Library_t *)Abc_FrameReadLibGen(), -AreaMulti );
    if ( DelayMulti != 0.0 )
        Mio_LibraryMultiDelay( (Mio_Library_t *)Abc_FrameReadLibGen(), -DelayMulti );

    // print a warning about choice nodes
    if ( fVerbose && Abc_NtkGetChoiceNum( pNtk ) )
        printf( "Performing mapping with choices.\n" );

    // compute switching activity
    fShowSwitching |= fSwitching;
    if ( fShowSwitching )
    {
        extern Vec_Int_t * Sim_NtkComputeSwitching( Abc_Ntk_t * pNtk, int nPatterns );
        vSwitching = Sim_NtkComputeSwitching( pNtk, 4096 );
        pSwitching = (float *)vSwitching->pArray;
    }

    // perform the mapping
    pMan = Abc_NtkToMap( pNtk, DelayTarget, fRecovery, pSwitching, fVerbose );
    if ( pSwitching ) Vec_IntFree( vSwitching );
    if ( pMan == NULL )
        return NULL;
clk = Abc_Clock();
    Map_ManSetSwitching( pMan, fSwitching );
    Map_ManSetSkipFanout( pMan, fSkipFanout );
    if ( fUseProfile )
        Map_ManSetUseProfile( pMan );
    if ( LogFan != 0 )
        Map_ManCreateNodeDelays( pMan, LogFan );
    if ( !Map_Mapping( pMan ) )
    {
        Map_ManFree( pMan );
        return NULL;
    }
//    Map_ManPrintStatsToFile( pNtk->pSpec, Map_ManReadAreaFinal(pMan), Map_ManReadRequiredGlo(pMan), Abc_Clock()-clk );

    // reconstruct the network after mapping (use buffers when user requested or in the area mode)
    pNtkNew = Abc_NtkFromMap( pMan, pNtk, fUseBuffs || (DelayTarget == (double)ABC_INFINITY) );
    if ( Mio_LibraryHasProfile(pLib) )
        Mio_LibraryTransferProfile2( (Mio_Library_t *)Abc_FrameReadLibGen(), pLib );
    Map_ManFree( pMan );
    if ( pNtkNew == NULL )
        return NULL;

    if ( pNtk->pExdc )
        pNtkNew->pExdc = Abc_NtkDup( pNtk->pExdc );
if ( fVerbose )
{
ABC_PRT( "Total runtime", Abc_Clock() - clkTotal );
}

    // make sure that everything is okay
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        printf( "Abc_NtkMap: The network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}